

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

_Bool stumpless_close_sqlite3_target_and_db(stumpless_target *target)

{
  sqlite3_target *target_00;
  int code;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
  }
  else if (target->type == STUMPLESS_SQLITE3_TARGET) {
    target_00 = (sqlite3_target *)target->id;
    code = sqlite3_close_v2(target_00->db);
    if (code == 0) {
      destroy_sqlite3_target(target_00);
      destroy_target(target);
      clear_error();
      return true;
    }
    raise_sqlite3_failure("could not close the sqlite3 database",code);
  }
  else {
    raise_target_incompatible("target type is incompatible with this operation");
  }
  return false;
}

Assistant:

bool
stumpless_close_sqlite3_target_and_db( const struct stumpless_target *target ) {
  struct sqlite3_target *db_target;
  if( unlikely( !target ) ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "target" ) );
    return false;
  }

  if( target->type != STUMPLESS_SQLITE3_TARGET ) {
    raise_target_incompatible( L10N_INVALID_TARGET_TYPE_ERROR_MESSAGE );
    return false;
  }

  // we use v2 here to prevent close from being blocked by pending transactions
  db_target = target->id;
  int sql_result = sqlite3_close_v2( db_target->db );
  if( sql_result != SQLITE_OK ) {
    raise_sqlite3_failure( L10N_SQLITE3_CLOSE_FAILED_ERROR_MESSAGE,
                           sql_result );
    return false;
  }

  destroy_sqlite3_target( db_target );
  destroy_target( target );
  clear_error(  );
  return true;
}